

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

void mocker::nasm::printModule(Module *module,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  shared_ptr<mocker::nasm::Directive> *extraout_RDX;
  shared_ptr<mocker::nasm::Directive> *extraout_RDX_00;
  shared_ptr<mocker::nasm::Directive> *extraout_RDX_01;
  shared_ptr<mocker::nasm::Directive> *directive;
  _Hash_node_base *p_Var3;
  nasm *this;
  char local_71;
  Module *local_70;
  string local_68;
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  local_48;
  
  local_70 = module;
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::vector(&local_48,&module->directives);
  if (local_48.
      super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    directive = extraout_RDX;
    this = (nasm *)local_48.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    do {
      fmtDirective_abi_cxx11_(&local_68,this,directive);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_68._M_dataplus._M_p,local_68._M_string_length);
      local_71 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_71,1);
      directive = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        directive = extraout_RDX_01;
      }
      this = this + 0x10;
    } while (this != (nasm *)local_48.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::~vector(&local_48);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  for (p_Var3 = (local_70->sections)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    printSection((Section *)(p_Var3 + 5),out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void printModule(const Module &module, std::ostream &out) {
  for (auto &directive : module.getDirectives())
    out << fmtDirective(directive) << '\n';
  out << std::endl;

  for (auto &kv : module.getSections()) {
    printSection(kv.second, out);
    out << std::endl;
  }
}